

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetRuntimeMemoryUsage(JsRuntimeHandle runtimeHandle,size_t *memoryUsage)

{
  JsErrorCode JVar1;
  JsrtRuntime *runtime;
  
  if (runtimeHandle != (JsRuntimeHandle)0x0) {
    if (memoryUsage == (size_t *)0x0) {
      JVar1 = JsErrorNullArgument;
    }
    else {
      *memoryUsage = 0;
      ThreadContext::ValidateThreadContext(*runtimeHandle);
      *memoryUsage = *(size_t *)(*(long *)(*runtimeHandle + 0x110) + 8);
      JVar1 = JsNoError;
    }
    return JVar1;
  }
  return JsErrorInvalidArgument;
}

Assistant:

CHAKRA_API JsGetRuntimeMemoryUsage(_In_ JsRuntimeHandle runtimeHandle, _Out_ size_t * memoryUsage)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(memoryUsage);
    *memoryUsage = 0;

    ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    AllocationPolicyManager * allocPolicyManager = threadContext->GetAllocationPolicyManager();

    *memoryUsage = allocPolicyManager->GetUsage();

    return JsNoError;
}